

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfparse.c
# Opt level: O3

int sf_parser_param(sf_parser *sfp,sf_vec *dest_key,sf_value *dest_value)

{
  uint8_t *puVar1;
  uint uVar2;
  int iVar3;
  uint8_t *puVar4;
  int iVar5;
  
  uVar2 = sfp->state;
  switch(uVar2 & 3) {
  case 0:
    iVar3 = parser_skip_inner_list(sfp);
    iVar5 = -1;
    if (iVar3 == 0) {
      uVar2 = sfp->state;
      goto switchD_0011702e_caseD_1;
    }
    break;
  case 1:
switchD_0011702e_caseD_1:
    uVar2 = uVar2 & 0xfffffffc | 2;
    sfp->state = uVar2;
  case 2:
    puVar4 = sfp->pos;
    puVar1 = sfp->end;
    if ((puVar4 == puVar1) || (*puVar4 != ';')) {
      sfp->state = uVar2 | 3;
      iVar5 = -2;
    }
    else {
      puVar4 = puVar4 + 1;
      sfp->pos = puVar4;
      iVar5 = -1;
      while (puVar4 != puVar1) {
        if (*puVar4 != ' ') {
          if (puVar4 == puVar1) {
            return -1;
          }
          iVar3 = parser_key(sfp,dest_key);
          if (iVar3 != 0) {
            return -1;
          }
          puVar4 = sfp->pos;
          if ((puVar4 != sfp->end) && (*puVar4 == '=')) {
            sfp->pos = puVar4 + 1;
            if (puVar4 + 1 == sfp->end) {
              return -1;
            }
            iVar3 = parser_bare_item(sfp,dest_value);
            return iVar3;
          }
          if (dest_value == (sf_value *)0x0) {
            return 0;
          }
          dest_value->type = SF_TYPE_BOOLEAN;
          dest_value->flags = 0;
          (dest_value->field_2).boolean = 1;
          return 0;
        }
        puVar4 = puVar4 + 1;
        sfp->pos = puVar4;
      }
    }
    break;
  case 3:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/sfparse.c"
                  ,0x283,"int sf_parser_param(sf_parser *, sf_vec *, sf_value *)");
  }
  return iVar5;
}

Assistant:

int sf_parser_param(sf_parser *sfp, sf_vec *dest_key, sf_value *dest_value) {
  int rv;

  switch (sfp->state & SF_STATE_OP_MASK) {
  case SF_STATE_BEFORE:
    rv = parser_skip_inner_list(sfp);
    if (rv != 0) {
      return rv;
    }

    /* fall through */
  case SF_STATE_BEFORE_PARAMS:
    parser_set_op_state(sfp, SF_STATE_PARAMS);

    break;
  case SF_STATE_PARAMS:
    break;
  default:
    assert(0);
    abort();
  }

  if (parser_eof(sfp) || *sfp->pos != ';') {
    parser_set_op_state(sfp, SF_STATE_AFTER);

    return SF_ERR_EOF;
  }

  ++sfp->pos;

  parser_discard_sp(sfp);
  if (parser_eof(sfp)) {
    return SF_ERR_PARSE_ERROR;
  }

  rv = parser_key(sfp, dest_key);
  if (rv != 0) {
    return rv;
  }

  if (parser_eof(sfp) || *sfp->pos != '=') {
    if (dest_value) {
      dest_value->type = SF_TYPE_BOOLEAN;
      dest_value->flags = SF_VALUE_FLAG_NONE;
      dest_value->boolean = 1;
    }

    return 0;
  }

  ++sfp->pos;

  if (parser_eof(sfp)) {
    return SF_ERR_PARSE_ERROR;
  }

  return parser_bare_item(sfp, dest_value);
}